

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

String __thiscall MiniScript::String::Format(String *this,int num,char *formatSpec)

{
  size_t sVar1;
  StringStorage *pSVar2;
  char *__s;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  ulong __n;
  String SVar4;
  char buf [32];
  char acStack_48 [40];
  
  snprintf(acStack_48,0x20,formatSpec,num);
  this->isTemp = false;
  sVar1 = strlen(acStack_48);
  if (sVar1 == 0) {
    this->ss = (StringStorage *)0x0;
    uVar3 = extraout_RDX;
  }
  else {
    pSVar2 = (StringStorage *)operator_new(0x30);
    __n = sVar1 + 1;
    (pSVar2->super_RefCountedStorage).refCount = 1;
    (pSVar2->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar2->dataSize = __n;
    pSVar2->charCount = -1;
    __s = (char *)operator_new__(__n);
    pSVar2->data = __s;
    memset(__s,0,__n);
    this->ss = pSVar2;
    memcpy(__s,acStack_48,__n);
    uVar3 = extraout_RDX_00;
  }
  SVar4._8_8_ = uVar3;
  SVar4.ss = (StringStorage *)this;
  return SVar4;
}

Assistant:

String String::Format(int num, const char* formatSpec) {
		char buf[32];
		snprintf(buf, 32, formatSpec, num);
		return buf;
	}